

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsModuleEvaluation(JsModuleRecord requestModule,JsValueRef *result)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  SourceTextModuleRecord *pSVar4;
  JsrtContext *context;
  JsrtContext *context_00;
  undefined4 extraout_var;
  undefined4 *puVar5;
  JsErrorCode JVar6;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  SmartFPUControlT<true> local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar6 = JsErrorInvalidArgument;
  if ((requestModule != (JsModuleRecord)0x0) && (*(int *)((long)requestModule + 8) == 0x65646f4d)) {
    pSVar4 = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (result != (JsValueRef *)0x0) {
      *result = (JsValueRef)0x0;
    }
    context = (JsrtContext *)
              Js::JavascriptLibrary::GetJsrtContext
                        ((((pSVar4->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary)
    ;
    context_00 = JsrtContext::GetCurrent();
    scriptContext =
         (((context->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                        ExceptionType_OutOfMemory);
    bVar2 = JsrtContext::TrySetCurrent(context);
    JVar6 = JsErrorWrongThread;
    if (bVar2) {
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_a0,scriptContext,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(scriptContext,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
      SmartFPUControlT<true>::SmartFPUControlT(&local_40);
      JVar6 = JsErrorBadFPUState;
      if (local_40.m_err == 0) {
        iVar3 = (*(pSVar4->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])(pSVar4);
        JVar6 = JsNoError;
        if (result != (JsValueRef *)0x0) {
          *result = (JsValueRef)CONCAT44(extraout_var,iVar3);
          JVar6 = JsNoError;
        }
      }
      SmartFPUControlT<true>::~SmartFPUControlT(&local_40);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
    }
    if (((JVar6 - JsErrorNoCurrentContext < 7) &&
        ((0x43U >> (JVar6 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
       (JVar6 == JsErrorOutOfMemory)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                         ,0x171,
                         "(errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated)"
                         ,
                         "errorCode != JsErrorFatal && errorCode != JsErrorNoCurrentContext && errorCode != JsErrorInExceptionState && errorCode != JsErrorInDisabledState && errorCode != JsErrorOutOfMemory && errorCode != JsErrorScriptException && errorCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    JsrtContext::TrySetCurrent(context_00);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  }
  return JVar6;
}

Assistant:

CHAKRA_API
JsModuleEvaluation(
    _In_ JsModuleRecord requestModule,
    _Outptr_result_maybenull_ JsValueRef* result)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (result != nullptr)
    {
        *result = JS_INVALID_REFERENCE;
    }
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        SmartFPUControl smartFpuControl;
        if (smartFpuControl.HasErr())
        {
            return JsErrorBadFPUState;
        }
        JsValueRef returnRef = moduleRecord->ModuleEvaluation();
        if (result != nullptr)
        {
            *result = returnRef;
        }
        return JsNoError;
    });
    return errorCode;
}